

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<std::array<unsigned_long,5ul>,void>
               (array<unsigned_long,_5UL> *container,ostream *os)

{
  long lVar1;
  
  std::operator<<(os,'{');
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 8) {
    if (lVar1 != 0) {
      std::operator<<(os,',');
    }
    std::operator<<(os,' ');
    ((void)((*{parm#2})<<{parm#1}))testing::internal::
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<unsigned_long,void>((unsigned_long *)((long)container->_M_elems + lVar1),os);
  }
  std::operator<<(os,' ');
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }